

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_entry.c
# Opt level: O1

void archive_entry_set_rdev(archive_entry *entry,dev_t m)

{
  byte *pbVar1;
  
  entry->stat_valid = L'\0';
  (entry->ae_stat).aest_rdev = m;
  (entry->ae_stat).aest_rdev_is_broken_down = L'\0';
  (entry->ae_stat).aest_rdevmajor = 0;
  (entry->ae_stat).aest_rdevminor = 0;
  pbVar1 = (byte *)((long)&entry->ae_set + 1);
  *pbVar1 = *pbVar1 | 0x20;
  return;
}

Assistant:

void
archive_entry_set_rdev(struct archive_entry *entry, __LA_DEV_T m)
{
	entry->stat_valid = 0;
	entry->ae_stat.aest_rdev = m;
	entry->ae_stat.aest_rdev_is_broken_down = 0;
	entry->ae_stat.aest_rdevmajor = 0;
	entry->ae_stat.aest_rdevminor = 0;
	entry->ae_set |= AE_SET_RDEV;
}